

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O3

void Abc_TtAndSharp(word *pOut,word *pIn1,word *pIn2,int nWords,int fCompl)

{
  ulong uVar1;
  
  if (fCompl == 0) {
    if (0 < nWords) {
      uVar1 = 0;
      do {
        pOut[uVar1] = pIn2[uVar1] & pIn1[uVar1];
        uVar1 = uVar1 + 1;
      } while ((uint)nWords != uVar1);
    }
  }
  else if (0 < nWords) {
    uVar1 = 0;
    do {
      pOut[uVar1] = ~pIn2[uVar1] & pIn1[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)nWords != uVar1);
  }
  return;
}

Assistant:

static inline void Abc_TtAndSharp( word * pOut, word * pIn1, word * pIn2, int nWords, int fCompl )
{
    int w;
    if ( fCompl )
        for ( w = 0; w < nWords; w++ )
            pOut[w] = pIn1[w] & ~pIn2[w];
    else
        for ( w = 0; w < nWords; w++ )
            pOut[w] = pIn1[w] & pIn2[w];
}